

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O3

void * evmap_io_get_fdinfo_(event_signal_map *map,int fd)

{
  void *pvVar1;
  
  pvVar1 = (void *)((long)map->entries[fd] + 0x10);
  if (map->entries[fd] == (void *)0x0) {
    pvVar1 = (void *)0x0;
  }
  return pvVar1;
}

Assistant:

void *
evmap_io_get_fdinfo_(struct event_io_map *map, evutil_socket_t fd)
{
	struct evmap_io *ctx;
	GET_IO_SLOT(ctx, map, fd, evmap_io);
	if (ctx)
		return ((char*)ctx) + sizeof(struct evmap_io);
	else
		return NULL;
}